

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O0

int If_ManCutAigDelay(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  int iVar1;
  int iVar2;
  If_Cut_t *pIVar3;
  uint *puVar4;
  bool bVar5;
  int local_2c;
  int Delay;
  int i;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  Vec_PtrClear(p->vVisited);
  local_2c = 0;
  while( true ) {
    bVar5 = false;
    if (local_2c < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      _Delay = If_ManObj(p,(int)(&pCut[1].Area)[local_2c]);
      bVar5 = _Delay != (If_Obj_t *)0x0;
    }
    if (!bVar5) break;
    if ((*(uint *)_Delay >> 9 & 1) != 0) {
      __assert_fail("pLeaf->fVisit == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0x49,"int If_ManCutAigDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
    }
    *(uint *)_Delay = *(uint *)_Delay & 0xfffffdff | 0x200;
    Vec_PtrPush(p->vVisited,_Delay);
    pIVar3 = If_ObjCutBest(_Delay);
    (_Delay->field_22).iCopy = (int)pIVar3->Delay;
    local_2c = local_2c + 1;
  }
  iVar1 = If_ManCutAigDelay_rec(p,pObj,p->vVisited);
  for (local_2c = 0; iVar2 = Vec_PtrSize(p->vVisited), local_2c < iVar2; local_2c = local_2c + 1) {
    puVar4 = (uint *)Vec_PtrEntry(p->vVisited,local_2c);
    *puVar4 = *puVar4 & 0xfffffdff;
  }
  return iVar1;
}

Assistant:

int If_ManCutAigDelay( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int i, Delay;
    Vec_PtrClear( p->vVisited );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->fVisit == 0 );
        pLeaf->fVisit = 1;
        Vec_PtrPush( p->vVisited, pLeaf );
        pLeaf->iCopy = If_ObjCutBest(pLeaf)->Delay;
    }
    Delay = If_ManCutAigDelay_rec( p, pObj, p->vVisited );
    Vec_PtrForEachEntry( If_Obj_t *, p->vVisited, pLeaf, i )
        pLeaf->fVisit = 0;
//    assert( Delay <= (int)pObj->Level );
    return Delay;
}